

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O3

void __thiscall QSplitterPrivate::recalc(QSplitterPrivate *this,bool update)

{
  undefined1 *puVar1;
  uint uVar2;
  Orientation OVar3;
  QWidget *this_00;
  QSplitterLayoutStruct *pQVar4;
  QSplitterHandle *pQVar5;
  ulong uVar6;
  uint uVar7;
  Representation RVar8;
  ulong uVar9;
  undefined8 uVar10;
  QSize QVar11;
  QSize QVar12;
  long lVar13;
  bool bVar14;
  int iVar15;
  byte bVar16;
  QWidget *w;
  byte bVar17;
  byte bVar18;
  int iVar19;
  ulong uVar20;
  int local_58;
  int local_54;
  int local_50;
  
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  uVar7 = (uint)(this->list).d.size;
  if ((int)uVar7 < 1) {
    local_58 = QFrame::frameWidth((QFrame *)this_00);
    local_58 = local_58 * 2;
    local_54 = 0xffffff;
    local_50 = local_58;
  }
  else {
    bVar18 = 1;
    uVar20 = 0;
    bVar16 = 1;
    do {
      pQVar4 = (this->list).d.ptr[uVar20];
      uVar2 = pQVar4->widget->data->widget_attributes;
      if (((uVar2 >> 0x10 & 1) == 0) && (bVar16 != 0)) {
        bVar16 = bVar16 & -(pQVar4->field_0x14 & 1);
      }
      bVar17 = (byte)(uVar2 >> 0x10) & 1;
      QWidget::setHidden(&pQVar4->handle->super_QWidget,(bool)(bVar18 | bVar17));
      bVar18 = bVar17 & bVar18;
      uVar20 = uVar20 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar20);
    if ((0 < (int)uVar7) && (bVar16 != 0)) {
      uVar20 = 0;
      do {
        pQVar4 = (this->list).d.ptr[uVar20];
        if ((pQVar4->widget->data->widget_attributes & 0x10000) == 0) {
          puVar1 = &pQVar4->field_0x14;
          *puVar1 = *puVar1 & 0xfe;
          break;
        }
        uVar20 = uVar20 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar20);
    }
    local_58 = QFrame::frameWidth((QFrame *)this_00);
    local_58 = local_58 * 2;
    local_50 = local_58;
    if ((int)uVar7 < 1) {
      local_54 = 0xffffff;
    }
    else {
      local_54 = 0xffffff;
      bVar14 = true;
      uVar20 = 0;
      iVar19 = local_58;
      do {
        pQVar4 = (this->list).d.ptr[uVar20];
        w = pQVar4->widget;
        if ((w->data->widget_attributes & 0x10000) == 0) {
          pQVar5 = pQVar4->handle;
          if ((((pQVar5->super_QWidget).data)->widget_attributes & 0x10000) == 0) {
            OVar3 = this->orient;
            uVar9 = (**(code **)(*(long *)&pQVar5->super_QWidget + 0x70))(pQVar5);
            uVar6 = uVar9 >> 0x20;
            if (OVar3 == Horizontal) {
              uVar6 = uVar9;
            }
            local_58 = local_58 + (int)uVar6;
            OVar3 = this->orient;
            uVar10 = (**(code **)(*(long *)&pQVar4->handle->super_QWidget + 0x70))();
            iVar15 = (int)((ulong)uVar10 >> 0x20);
            if (OVar3 == Horizontal) {
              iVar15 = (int)uVar10;
            }
            iVar19 = iVar19 + iVar15;
            w = pQVar4->widget;
          }
          QVar11 = qSmartMinSize(w);
          RVar8 = QVar11.ht.m_i;
          if (this->orient == Horizontal) {
            RVar8 = QVar11.wd.m_i;
          }
          local_58 = RVar8.m_i + local_58;
          QVar12 = qSmartMaxSize(pQVar4->widget,(Alignment)0x0);
          RVar8 = QVar12.ht.m_i;
          if (this->orient == Horizontal) {
            RVar8 = QVar12.wd.m_i;
          }
          iVar19 = RVar8.m_i + iVar19;
          QVar12 = (QSize)((ulong)QVar11 >> 0x20);
          if (this->orient == Vertical) {
            QVar12 = QVar11;
          }
          if (local_50 <= QVar12.wd.m_i.m_i) {
            local_50 = QVar12.wd.m_i.m_i;
          }
          QVar12 = qSmartMaxSize(pQVar4->widget,(Alignment)0x0);
          QVar11 = (QSize)((ulong)QVar12 >> 0x20);
          if (this->orient == Vertical) {
            QVar11 = QVar12;
          }
          RVar8 = QVar11.wd.m_i;
          if (RVar8.m_i < 1) {
            bVar14 = false;
          }
          else {
            if (local_54 < RVar8.m_i) {
              RVar8.m_i = local_54;
            }
            local_54 = RVar8.m_i;
            bVar14 = false;
          }
        }
        uVar20 = uVar20 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar20);
      if (!bVar14) {
        iVar15 = 0xffffff;
        if (iVar19 < 0xffffff) {
          iVar15 = iVar19;
        }
        goto LAB_004832bd;
      }
    }
  }
  lVar13 = QMetaObject::cast((QObject *)&QSplitter::staticMetaObject);
  if (lVar13 != 0) {
    local_54 = 0;
  }
  iVar15 = 0xffffff;
  if (lVar13 != 0) {
    iVar15 = 0;
  }
LAB_004832bd:
  if (local_54 <= local_50) {
    local_54 = local_50;
  }
  if (update) {
    if (this->orient == Horizontal) {
      QWidget::setMaximumSize(this_00,iVar15,local_54);
      bVar16 = (byte)(this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                     super_QFlagsStorage<Qt::WindowType>.i;
      iVar19 = local_50;
      local_50 = local_58;
    }
    else {
      QWidget::setMaximumSize(this_00,local_54,iVar15);
      bVar16 = (byte)(this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                     super_QFlagsStorage<Qt::WindowType>.i;
      iVar19 = local_58;
    }
    if ((bVar16 & 1) != 0) {
      QWidget::setMinimumSize(this_00,local_50,iVar19);
    }
    doResize(this);
    QWidget::updateGeometry(this_00);
    return;
  }
  this->field_0x2a5 = 1;
  return;
}

Assistant:

void QSplitterPrivate::recalc(bool update)
{
    Q_Q(QSplitter);
    int n = list.size();
    /*
      Splitter handles before the first visible widget or right
      before a hidden widget must be hidden.
    */
    bool first = true;
    bool allInvisible = n != 0;
    for (int i = 0; i < n ; ++i) {
        QSplitterLayoutStruct *s = list.at(i);
        bool widgetHidden = s->widget->isHidden();
        if (allInvisible && !widgetHidden && !s->collapsed)
            allInvisible = false;
        s->handle->setHidden(first || widgetHidden);
        if (!widgetHidden)
            first = false;
    }

    if (allInvisible)
        for (int i = 0; i < n ; ++i) {
            QSplitterLayoutStruct *s = list.at(i);
            if (!s->widget->isHidden()) {
                s->collapsed = false;
                break;
            }
        }

    int fi = 2 * q->frameWidth();
    int maxl = fi;
    int minl = fi;
    int maxt = QWIDGETSIZE_MAX;
    int mint = fi;
    /*
      calculate min/max sizes for the whole splitter
    */
    bool empty = true;
    for (int j = 0; j < n; j++) {
        QSplitterLayoutStruct *s = list.at(j);

        if (!s->widget->isHidden()) {
            empty = false;
            if (!s->handle->isHidden()) {
                minl += s->getHandleSize(orient);
                maxl += s->getHandleSize(orient);
            }

            QSize minS = qSmartMinSize(s->widget);
            minl += pick(minS);
            maxl += pick(qSmartMaxSize(s->widget));
            mint = qMax(mint, trans(minS));
            int tm = trans(qSmartMaxSize(s->widget));
            if (tm > 0)
                maxt = qMin(maxt, tm);
        }
    }

    if (empty) {
        if (qobject_cast<QSplitter *>(parent)) {
            // nested splitters; be nice
            maxl = maxt = 0;
        } else {
            // QSplitter with no children yet
            maxl = QWIDGETSIZE_MAX;
        }
    } else {
        maxl = qMin<int>(maxl, QWIDGETSIZE_MAX);
    }
    if (maxt < mint)
        maxt = mint;

    if (update) {
        if (orient == Qt::Horizontal) {
            q->setMaximumSize(maxl, maxt);
            if (q->isWindow())
                q->setMinimumSize(minl,mint);
        } else {
            q->setMaximumSize(maxt, maxl);
            if (q->isWindow())
                q->setMinimumSize(mint,minl);
        }
        doResize();
        q->updateGeometry();
    } else {
        firstShow = true;
    }
}